

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::addNamePattern(TestSpecParser *this)

{
  ulong uVar1;
  shared_ptr<Catch::TestSpec::Pattern> *in_RDI;
  PatternPtr pattern;
  string token;
  TestSpecParser *in_stack_00000078;
  shared_ptr<Catch::TestSpec::ExcludedPattern> *in_stack_ffffffffffffff88;
  value_type *in_stack_ffffffffffffff98;
  vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_28 [40];
  
  preprocessPattern_abi_cxx11_(in_stack_00000078);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::make_shared<Catch::TestSpec::NamePattern,std::__cxx11::string&,std::__cxx11::string&>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::shared_ptr<Catch::TestSpec::Pattern>::shared_ptr<Catch::TestSpec::NamePattern,void>
              (in_RDI,(shared_ptr<Catch::TestSpec::NamePattern> *)in_stack_ffffffffffffff88);
    clara::std::shared_ptr<Catch::TestSpec::NamePattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::NamePattern> *)0x134032);
    if (((ulong)(in_RDI->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi & 1) != 0) {
      std::make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                ((shared_ptr<Catch::TestSpec::Pattern> *)in_stack_ffffffffffffffb8);
      std::shared_ptr<Catch::TestSpec::Pattern>::operator=(in_RDI,in_stack_ffffffffffffff88);
      clara::std::shared_ptr<Catch::TestSpec::ExcludedPattern>::~shared_ptr
                ((shared_ptr<Catch::TestSpec::ExcludedPattern> *)0x134067);
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    clara::std::shared_ptr<Catch::TestSpec::Pattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::Pattern> *)0x1340b5);
  }
  std::__cxx11::string::clear();
  *(undefined1 *)
   &(in_RDI->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
    _M_pi = 0;
  *(undefined4 *)
   &(in_RDI->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = 0;
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void TestSpecParser::addNamePattern() {
        auto token = preprocessPattern();

        if (!token.empty()) {
            TestSpec::PatternPtr pattern = std::make_shared<TestSpec::NamePattern>(token, m_substring);
            if (m_exclusion)
                pattern = std::make_shared<TestSpec::ExcludedPattern>(pattern);
            m_currentFilter.m_patterns.push_back(pattern);
        }
        m_substring.clear();
        m_exclusion = false;
        m_mode = None;
    }